

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

void sexp_shrink_bcode(sexp ctx,sexp_uint_t i)

{
  sexp psVar1;
  
  if ((((((ctx->value).opcode.methods)->value).type.cpl)->value).type.getters != (sexp)i) {
    psVar1 = sexp_alloc_tagged_aux(ctx,i + 0x30,0x18);
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      (psVar1->value).flonum = (((((ctx->value).opcode.methods)->value).type.cpl)->value).flonum;
      (psVar1->value).bytecode.length = i;
      (psVar1->value).type.cpl = (((((ctx->value).opcode.methods)->value).type.cpl)->value).type.cpl
      ;
      (psVar1->value).type.slots =
           (((((ctx->value).opcode.methods)->value).type.cpl)->value).type.slots;
      memcpy((void *)((long)&psVar1->value + 0x28),
             (void *)((long)&((((ctx->value).opcode.methods)->value).type.cpl)->value + 0x28),i);
      (((ctx->value).opcode.methods)->value).type.cpl = psVar1;
    }
  }
  return;
}

Assistant:

void sexp_shrink_bcode (sexp ctx, sexp_uint_t i) {
  sexp tmp;
  if (sexp_bytecode_length(sexp_context_bc(ctx)) != i) {
    tmp = sexp_alloc_bytecode(ctx, i);
    if (!sexp_exceptionp(tmp)) {
      sexp_bytecode_name(tmp) = sexp_bytecode_name(sexp_context_bc(ctx));
      sexp_bytecode_length(tmp) = i;
      sexp_bytecode_literals(tmp)
        = sexp_bytecode_literals(sexp_context_bc(ctx));
      sexp_bytecode_source(tmp)
        = sexp_bytecode_source(sexp_context_bc(ctx));
      memcpy(sexp_bytecode_data(tmp),
             sexp_bytecode_data(sexp_context_bc(ctx)),
             i);
      sexp_context_bc(ctx) = tmp;
    }
  }
}